

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O2

void __thiscall ninx::evaluator::DefaultEvaluator::visit(DefaultEvaluator *this,Block *e)

{
  pointer puVar1;
  Statement *pSVar2;
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  *pvVar3;
  map<unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>_>_>_>
  *pmVar4;
  Block *target_object;
  FunctionDefinition *function;
  Block *pBVar5;
  pointer *__ptr;
  unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
  *statement;
  pointer puVar6;
  string block_output;
  undefined1 local_68 [16];
  Block *local_58;
  string local_50;
  
  pvVar3 = parser::element::Block::get_children(e);
  puVar1 = (pvVar3->
           super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (pvVar3->
                super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    pSVar2 = (puVar6->_M_t).
             super___uniq_ptr_impl<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::Statement_*,_std::default_delete<ninx::parser::element::Statement>_>
             .super__Head_base<0UL,_ninx::parser::element::Statement_*,_false>._M_head_impl;
    (**(code **)((long)(pSVar2->super_ASTElement)._vptr_ASTElement + 0x28))(pSVar2,e);
    pSVar2 = (puVar6->_M_t).
             super___uniq_ptr_impl<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::Statement_*,_std::default_delete<ninx::parser::element::Statement>_>
             .super__Head_base<0UL,_ninx::parser::element::Statement_*,_false>._M_head_impl;
    (**(code **)((long)(pSVar2->super_ASTElement)._vptr_ASTElement + 0x10))(pSVar2,this);
  }
  pmVar4 = parser::element::Block::__get_late_calls(e);
  local_58 = (Block *)&(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
  for (pBVar5 = (Block *)(pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      pBVar5 != local_58; pBVar5 = (Block *)std::_Rb_tree_increment((_Rb_tree_node_base *)pBVar5)) {
    parser::element::Block::__set_output_segment_position
              (e,*(int *)&(pBVar5->statements).
                          super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
    target_object =
         parser::util::LateCallDescriptor::get_target_object
                   ((LateCallDescriptor *)
                    (pBVar5->statements).
                    super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    function = parser::util::LateCallDescriptor::get_function
                         ((LateCallDescriptor *)
                          (pBVar5->statements).
                          super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    parser::util::LateCallDescriptor::get_body
              ((LateCallDescriptor *)
               (pBVar5->statements).
               super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    parser::element::ASTElement::clone<ninx::parser::element::Block>((ASTElement *)local_68);
    evaluate_function(this,target_object,function,
                      (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                       *)local_68);
    if ((Block *)local_68._0_8_ != (Block *)0x0) {
      (**(code **)(*(_func_int **)local_68._0_8_ + 8))();
    }
    local_68._0_8_ =
         (__uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
          )0x0;
  }
  parser::element::Block::__render_output_abi_cxx11_(&local_50,e);
  pBVar5 = (e->super_Expression).super_Statement.super_ASTElement.__output_block;
  if (pBVar5 == (Block *)0x0) {
    std::operator<<(this->output,(string *)&local_50);
  }
  else {
    parser::element::Block::__add_output_segment(pBVar5,&local_50);
  }
  parser::element::ASTElement::clone<ninx::parser::element::Block>((ASTElement *)(local_68 + 8));
  reset_return_block();
  current_return_block = (Block *)local_68._8_8_;
  local_68._8_8_ = (Block *)0x0;
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::Block *e) {
    for (auto &statement : e->get_children()) {
        statement->__set_output_block(e);
        statement->accept(this);
    }

    // Evaluate late calls
    for (auto& call : e->__get_late_calls()) {
        size_t position {call.first};

        e->__set_output_segment_position(position);

        evaluate_function(call.second->get_target_object(), call.second->get_function(), call.second->get_body()->clone<ninx::parser::element::Block>());
    }

    auto block_output {e->__render_output()};

    if (e->__get_output_block()) {
        e->__get_output_block()->__add_output_segment(block_output);
    }else{
        this->output << block_output;
    }

    // Clone the block and make it available as a return value
    replace_return_block(e->clone<ninx::parser::element::Block>());
}